

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O2

QList<QSslCertificateExtension> * __thiscall
QSslCertificatePrivate::extensions
          (QList<QSslCertificateExtension> *__return_storage_ptr__,QSslCertificatePrivate *this)

{
  X509Certificate *pXVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  int iVar5;
  int extraout_var;
  QSslCertificateExtensionPrivate *pQVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  QSslCertificateExtension ext;
  QSslCertificateExtension local_60;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QSslCertificateExtension *)0x0;
  pXVar1 = (this->backend)._M_t.
           super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
           ._M_t.
           super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
           .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl;
  if (pXVar1 != (X509Certificate *)0x0) {
    iVar5 = (*pXVar1->_vptr_X509Certificate[0x11])();
    lVar7 = 0;
    lVar8 = CONCAT44(extraout_var,iVar5);
    if (CONCAT44(extraout_var,iVar5) == 0 || extraout_var < 0) {
      lVar8 = lVar7;
    }
    for (; lVar8 != lVar7; lVar7 = lVar7 + 1) {
      local_60.d.d.ptr = (QSharedDataPointer<QSslCertificateExtensionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QSslCertificateExtension::QSslCertificateExtension(&local_60);
      pXVar1 = (this->backend)._M_t.
               super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
               .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl;
      (*pXVar1->_vptr_X509Certificate[0x12])(&local_58,pXVar1,lVar7);
      pQVar6 = QSharedDataPointer<QSslCertificateExtensionPrivate>::operator->(&local_60.d);
      pDVar3 = (pQVar6->oid).d.d;
      pcVar4 = (pQVar6->oid).d.ptr;
      (pQVar6->oid).d.d = local_58.d;
      (pQVar6->oid).d.ptr = local_58.ptr;
      qVar2 = (pQVar6->oid).d.size;
      (pQVar6->oid).d.size = local_58.size;
      local_58.d = pDVar3;
      local_58.ptr = pcVar4;
      local_58.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      pXVar1 = (this->backend)._M_t.
               super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
               .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl;
      (*pXVar1->_vptr_X509Certificate[0x13])(&local_58,pXVar1,lVar7);
      pQVar6 = QSharedDataPointer<QSslCertificateExtensionPrivate>::operator->(&local_60.d);
      pDVar3 = (pQVar6->name).d.d;
      pcVar4 = (pQVar6->name).d.ptr;
      (pQVar6->name).d.d = local_58.d;
      (pQVar6->name).d.ptr = local_58.ptr;
      qVar2 = (pQVar6->name).d.size;
      (pQVar6->name).d.size = local_58.size;
      local_58.d = pDVar3;
      local_58.ptr = pcVar4;
      local_58.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      pXVar1 = (this->backend)._M_t.
               super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
               .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl;
      (*pXVar1->_vptr_X509Certificate[0x14])(&local_58,pXVar1,lVar7);
      pQVar6 = QSharedDataPointer<QSslCertificateExtensionPrivate>::operator->(&local_60.d);
      QVariant::operator=(&pQVar6->value,(QVariant *)&local_58);
      QVariant::~QVariant((QVariant *)&local_58);
      pXVar1 = (this->backend)._M_t.
               super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
               .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl;
      iVar5 = (*pXVar1->_vptr_X509Certificate[0x15])(pXVar1,lVar7);
      pQVar6 = QSharedDataPointer<QSslCertificateExtensionPrivate>::operator->(&local_60.d);
      pQVar6->critical = SUB41(iVar5,0);
      pXVar1 = (this->backend)._M_t.
               super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
               .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl;
      iVar5 = (*pXVar1->_vptr_X509Certificate[0x16])(pXVar1,lVar7);
      pQVar6 = QSharedDataPointer<QSslCertificateExtensionPrivate>::operator->(&local_60.d);
      pQVar6->supported = SUB41(iVar5,0);
      QList<QSslCertificateExtension>::emplaceBack<QSslCertificateExtension_const&>
                (__return_storage_ptr__,&local_60);
      QSslCertificateExtension::~QSslCertificateExtension(&local_60);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QSslCertificateExtension> QSslCertificatePrivate::extensions() const
{
    QList<QSslCertificateExtension> result;

    if (backend.get()) {
        auto nExt = backend->numberOfExtensions();
        for (decltype (nExt) i = 0; i < nExt; ++i) {
            QSslCertificateExtension ext;
            ext.d->oid = backend->oidForExtension(i);
            ext.d->name = backend->nameForExtension(i);
            ext.d->value = backend->valueForExtension(i);
            ext.d->critical = backend->isExtensionCritical(i);
            ext.d->supported = backend->isExtensionSupported(i);
            result << ext;
        }
    }

    return result;
}